

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v6::internal::buffer<char>::append<char>(buffer<char> *this,char *begin,char *end)

{
  ptrdiff_t _Num;
  ulong uVar1;
  
  uVar1 = this->size_ + ((long)end - (long)begin);
  if (this->capacity_ < uVar1) {
    (**this->_vptr_buffer)(this,uVar1);
  }
  if (end != begin) {
    memmove(this->ptr_ + this->size_,begin,(long)end - (long)begin);
  }
  this->size_ = uVar1;
  return;
}

Assistant:

void buffer<T>::append(const U* begin, const U* end) {
  std::size_t new_size = size_ + to_unsigned(end - begin);
  reserve(new_size);
  std::uninitialized_copy(begin, end, make_checked(ptr_, capacity_) + size_);
  size_ = new_size;
}